

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

PhysicalDevice * __thiscall
vkb::PhysicalDeviceSelector::populate_device_details
          (PhysicalDevice *__return_storage_ptr__,PhysicalDeviceSelector *this,
          VkPhysicalDevice vk_phys_device,GenericFeatureChain *src_extended_features_chain)

{
  pointer pVVar1;
  VkResult VVar2;
  pointer __s;
  undefined8 *puVar3;
  GenericFeatureChain fill_chain;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> available_extensions;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> queue_families;
  VkPhysicalDevice local_188;
  PhysicalDeviceSelector *local_180;
  _Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  local_178;
  GenericFeatureChain *local_160;
  _Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> local_158;
  _Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> local_138;
  VkPhysicalDeviceFeatures2 local_120;
  
  local_188 = vk_phys_device;
  local_160 = src_extended_features_chain;
  memset(__return_storage_ptr__,0,0x6c0);
  PhysicalDevice::PhysicalDevice(__return_storage_ptr__);
  __return_storage_ptr__->physical_device = vk_phys_device;
  __return_storage_ptr__->surface = (this->instance_info).surface;
  __return_storage_ptr__->defer_surface_initialization =
       (this->criteria).defer_surface_initialization;
  __return_storage_ptr__->instance_version = (this->instance_info).version;
  local_180 = this;
  detail::
  get_vector_noerror<VkQueueFamilyProperties,void(*&)(VkPhysicalDevice_T*,unsigned_int*,VkQueueFamilyProperties*),VkPhysicalDevice_T*&>
            ((vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *)&local_138
             ,(detail *)(detail::vulkan_functions()::v + 0xa0),
             (_func_void_VkPhysicalDevice_T_ptr_uint_ptr_VkQueueFamilyProperties_ptr **)&local_188,
             (VkPhysicalDevice_T **)src_extended_features_chain);
  std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::operator=
            (&__return_storage_ptr__->queue_families,
             (vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *)&local_138
            );
  (*(code *)detail::vulkan_functions()::v._152_8_)(local_188,&__return_storage_ptr__->properties);
  (*(code *)detail::vulkan_functions()::v._128_8_)(local_188,&__return_storage_ptr__->features);
  (*(code *)detail::vulkan_functions()::v._168_8_)
            (local_188,&__return_storage_ptr__->memory_properties);
  std::__cxx11::string::assign((char *)__return_storage_ptr__);
  local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_120.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  local_120._4_4_ = 0;
  VVar2 = detail::
          get_vector<VkExtensionProperties,VkResult(*&)(VkPhysicalDevice_T*,char_const*,unsigned_int*,VkExtensionProperties*),VkPhysicalDevice_T*&,decltype(nullptr)>
                    ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                     &local_158,
                     (_func_VkResult_VkPhysicalDevice_T_ptr_char_ptr_uint_ptr_VkExtensionProperties_ptr
                      **)(detail::vulkan_functions()::v + 0xb0),&local_188,(void **)&local_120);
  pVVar1 = local_158._M_impl.super__Vector_impl_data._M_finish;
  if (VVar2 != VK_SUCCESS) goto LAB_0011b8f9;
  for (__s = local_158._M_impl.super__Vector_impl_data._M_start; __s != pVVar1; __s = __s + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,__s->extensionName,(allocator<char> *)&local_178);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &__return_storage_ptr__->available_extensions,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120);
    std::__cxx11::string::~string((string *)&local_120);
  }
  __return_storage_ptr__->properties2_ext_enabled =
       (local_180->instance_info).properties2_ext_enabled;
  std::
  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ::vector((vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
            *)&local_178,&local_160->nodes);
  if (local_178._M_impl.super__Vector_impl_data._M_start !=
      local_178._M_impl.super__Vector_impl_data._M_finish) {
    if ((local_180->instance_info).version < 0x401000) {
      if ((local_180->instance_info).properties2_ext_enabled == false) goto LAB_0011b8ef;
      puVar3 = (undefined8 *)(detail::vulkan_functions()::v + 0x90);
    }
    else {
      puVar3 = (undefined8 *)(detail::vulkan_functions()::v + 0x88);
    }
    memset(&local_120,0,0xf0);
    detail::GenericFeatureChain::chain_up((GenericFeatureChain *)&local_178,&local_120);
    (*(code *)*puVar3)(local_188,&local_120);
    std::
    vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
    ::operator=(&(__return_storage_ptr__->extended_features_chain).nodes,
                (vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                 *)&local_178);
  }
LAB_0011b8ef:
  std::
  _Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ::~_Vector_base(&local_178);
LAB_0011b8f9:
  std::_Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::~_Vector_base
            (&local_158);
  std::_Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::
  ~_Vector_base(&local_138);
  return __return_storage_ptr__;
}

Assistant:

PhysicalDevice PhysicalDeviceSelector::populate_device_details(
    VkPhysicalDevice vk_phys_device, detail::GenericFeatureChain const& src_extended_features_chain) const {
    PhysicalDevice physical_device{};
    physical_device.physical_device = vk_phys_device;
    physical_device.surface = instance_info.surface;
    physical_device.defer_surface_initialization = criteria.defer_surface_initialization;
    physical_device.instance_version = instance_info.version;
    auto queue_families = detail::get_vector_noerror<VkQueueFamilyProperties>(
        detail::vulkan_functions().fp_vkGetPhysicalDeviceQueueFamilyProperties, vk_phys_device);
    physical_device.queue_families = queue_families;

    detail::vulkan_functions().fp_vkGetPhysicalDeviceProperties(vk_phys_device, &physical_device.properties);
    detail::vulkan_functions().fp_vkGetPhysicalDeviceFeatures(vk_phys_device, &physical_device.features);
    detail::vulkan_functions().fp_vkGetPhysicalDeviceMemoryProperties(vk_phys_device, &physical_device.memory_properties);

    physical_device.name = physical_device.properties.deviceName;

    std::vector<VkExtensionProperties> available_extensions;
    auto available_extensions_ret = detail::get_vector<VkExtensionProperties>(
        available_extensions, detail::vulkan_functions().fp_vkEnumerateDeviceExtensionProperties, vk_phys_device, nullptr);
    if (available_extensions_ret != VK_SUCCESS) return physical_device;
    for (const auto& ext : available_extensions) {
        physical_device.available_extensions.push_back(&ext.extensionName[0]);
    }

    physical_device.properties2_ext_enabled = instance_info.properties2_ext_enabled;

    auto fill_chain = src_extended_features_chain;

    bool instance_is_1_1 = instance_info.version >= VKB_VK_API_VERSION_1_1;
    if (!fill_chain.nodes.empty() && (instance_is_1_1 || instance_info.properties2_ext_enabled)) {
        VkPhysicalDeviceFeatures2 local_features{};
        fill_chain.chain_up(local_features);
        // Use KHR function if not able to use the core function
        if (instance_is_1_1) {
            detail::vulkan_functions().fp_vkGetPhysicalDeviceFeatures2(vk_phys_device, &local_features);
        } else {
            detail::vulkan_functions().fp_vkGetPhysicalDeviceFeatures2KHR(vk_phys_device, &local_features);
        }
        physical_device.extended_features_chain = fill_chain;
    }

    return physical_device;
}